

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

uint32_t * parsed_skip(uint32_t *pptr,uint32_t skiptype)

{
  uint uVar1;
  int local_20;
  uint32_t meta;
  uint32_t nestlevel;
  uint32_t skiptype_local;
  uint32_t *pptr_local;
  
  local_20 = 0;
  _nestlevel = pptr;
  do {
    uVar1 = (uint)*(ushort *)((long)_nestlevel + 2);
    if (uVar1 == 0x8001) {
      if ((local_20 == 0) && (skiptype == 0)) {
        return _nestlevel;
      }
LAB_00154c79:
      if (0x3f < (uVar1 & 0x7fff)) {
        return (uint32_t *)0x0;
      }
      _nestlevel = _nestlevel + (int)(uint)meta_extra_lengths[uVar1 & 0x7fff];
    }
    else {
      if (uVar1 == 0x8002) {
LAB_00154c3d:
        local_20 = local_20 + 1;
        goto LAB_00154c79;
      }
      if (uVar1 == 0x8003) {
        if (9 < (*_nestlevel & 0xffff)) {
          _nestlevel = _nestlevel + 2;
        }
        goto LAB_00154c79;
      }
      if (uVar1 == 0x8008) goto LAB_00154c3d;
      if (uVar1 == 0x800d) {
        if (skiptype == 1) {
          return _nestlevel;
        }
        goto LAB_00154c79;
      }
      if (((((uVar1 == 0x800f) || (uVar1 == 0x8010)) || (uVar1 == 0x8011)) ||
          ((uVar1 == 0x8012 || (uVar1 == 0x8013)))) || ((uVar1 == 0x8014 || (uVar1 == 0x8015))))
      goto LAB_00154c3d;
      if (uVar1 == 0x8018) {
        if ((ushort)*_nestlevel - 0xf < 2) {
          _nestlevel = _nestlevel + 1;
        }
        else if ((ushort)*_nestlevel - 0x1b < 2) {
          _nestlevel = _nestlevel + 3;
        }
        goto LAB_00154c79;
      }
      if (uVar1 == 0x8019) {
        if (local_20 == 0) {
          return _nestlevel;
        }
        local_20 = local_20 + -1;
        goto LAB_00154c79;
      }
      if ((((uVar1 == 0x801a) || (uVar1 == 0x8022)) ||
          ((uVar1 == 0x8023 || (((uVar1 == 0x8024 || (uVar1 == 0x8025)) || (uVar1 == 0x8026)))))) ||
         ((uVar1 == 0x8027 || (uVar1 == 0x8028)))) goto LAB_00154c3d;
      if (((uVar1 == 0x8029) || (uVar1 == 0x802d)) ||
         ((uVar1 == 0x802f || ((uVar1 == 0x8031 || (uVar1 == 0x8033)))))) {
        _nestlevel = _nestlevel + _nestlevel[1];
        goto LAB_00154c79;
      }
      if (0x7fffffff < uVar1 << 0x10) goto LAB_00154c79;
    }
    _nestlevel = _nestlevel + 1;
  } while( true );
}

Assistant:

static uint32_t *
parsed_skip(uint32_t *pptr, uint32_t skiptype)
{
uint32_t nestlevel = 0;

for (;; pptr++)
  {
  uint32_t meta = META_CODE(*pptr);

  switch(meta)
    {
    default:  /* Just skip over most items */
    if (meta < META_END) continue;  /* Literal */
    break;

    /* This should never occur. */

    case META_END:
    return NULL;

    /* The data for these items is variable in length. */

    case META_BACKREF:  /* Offset is present only if group >= 10 */
    if (META_DATA(*pptr) >= 10) pptr += SIZEOFFSET;
    break;

    case META_ESCAPE:   /* A few escapes are followed by data items. */
    switch (META_DATA(*pptr))
      {
      case ESC_P:
      case ESC_p:
      pptr += 1;
      break;

      case ESC_g:
      case ESC_k:
      pptr += 1 + SIZEOFFSET;
      break;
      }
    break;

    case META_MARK:     /* Add the length of the name. */
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1];
    break;

    /* These are the "active" items in this loop. */

    case META_CLASS_END:
    if (skiptype == PSKIP_CLASS) return pptr;
    break;

    case META_ATOMIC:
    case META_CAPTURE:
    case META_COND_ASSERT:
    case META_COND_DEFINE:
    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    case META_COND_VERSION:
    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_LOOKAHEAD_NA:
    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    case META_LOOKBEHIND_NA:
    case META_NOCAPTURE:
    case META_SCRIPT_RUN:
    nestlevel++;
    break;

    case META_ALT:
    if (nestlevel == 0 && skiptype == PSKIP_ALT) return pptr;
    break;

    case META_KET:
    if (nestlevel == 0) return pptr;
    nestlevel--;
    break;
    }

  /* The extra data item length for each meta is in a table. */

  meta = (meta >> 16) & 0x7fff;
  if (meta >= sizeof(meta_extra_lengths)) return NULL;
  pptr += meta_extra_lengths[meta];
  }
/* Control never reaches here */
return pptr;
}